

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddPegoutTxOut
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType bitcoin_net_type,
          Pubkey *online_pubkey,Privkey *master_online_key,string *btc_descriptor,
          uint32_t bip32_counter,ByteData *whitelist,NetType elements_net_type,
          Address *btc_derive_address)

{
  pointer puVar1;
  char cVar2;
  uint32_t uVar3;
  Script local_288;
  Pubkey local_248;
  ByteData local_230;
  ConfidentialTransactionContext *local_210;
  ConfidentialAssetId *local_208;
  Script *local_200;
  ByteData local_1f8;
  Script script;
  Script locking_script;
  void *local_160;
  void *local_148;
  code *local_130 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_210 = this;
  local_208 = (ConfidentialAssetId *)value;
  local_200 = (Script *)asset;
  cfd::core::Script::Script(&script);
  cfd::core::Pubkey::Pubkey(&local_248);
  cfd::core::ByteData::ByteData(&local_230);
  cVar2 = cfd::core::Pubkey::IsValid();
  if (cVar2 != '\0') {
    cVar2 = cfd::core::Privkey::IsValid();
    if (cVar2 != '\0') {
      cfd::core::Address::Address((Address *)&locking_script);
      cfd::core::ByteData::ByteData(&local_1f8);
      cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
                ((Pubkey *)&local_288,(Privkey *)online_pubkey,(string *)master_online_key,
                 (uint)btc_descriptor,(ByteData *)(ulong)bip32_counter,(NetType)whitelist,
                 (ByteData *)(ulong)bitcoin_net_type,(NetType)&local_1f8,
                 (Address *)(ulong)elements_net_type);
      puVar1 = local_248.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_288._vptr_Script;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_288.script_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_288.script_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_288._vptr_Script = (_func_int **)0x0;
      local_288.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((_func_int **)puVar1 != (_func_int **)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_288.script_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_288.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_288.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_288.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_288.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      if (local_288.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(local_288.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (local_288._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_288._vptr_Script);
      }
      if (local_1f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::Address::GetAddress_abi_cxx11_();
      puVar1 = local_288.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_288._vptr_Script !=
          (_func_int **)
          ((long)&local_288.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_288._vptr_Script);
      }
      if (puVar1 != (pointer)0x0) {
        cfd::core::Address::GetLockingScript();
        cfd::core::Script::operator=(&script,&local_288);
        core::Script::~Script(&local_288);
        if (btc_derive_address != (Address *)0x0) {
          cfd::core::Address::operator=(btc_derive_address,(Address *)&locking_script);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      core::Script::~Script(&local_a0);
      local_130[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_b8);
      core::TapBranch::~TapBranch((TapBranch *)local_130);
      if (local_148 != (void *)0x0) {
        operator_delete(local_148);
      }
      if (local_160 != (void *)0x0) {
        operator_delete(local_160);
      }
      if (locking_script.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(locking_script.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
          locking_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != &locking_script.script_stack_) {
        operator_delete(locking_script.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      goto LAB_001fa4bf;
    }
  }
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::operator=(&script,&locking_script);
  core::Script::~Script(&locking_script);
LAB_001fa4bf:
  cfd::core::ScriptUtil::CreatePegoutLogkingScript
            ((BlockHash *)&locking_script,(Script *)genesisblock_hash,(Pubkey *)&script,
             &local_248.data_);
  uVar3 = cfd::core::ConfidentialTransaction::AddTxOut((Amount *)local_210,local_208,local_200);
  core::Script::~Script(&locking_script);
  if (local_230.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((_func_int **)
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_248.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&script);
  return uVar3;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType bitcoin_net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && master_online_key.IsValid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, bitcoin_net_type, ByteData(), elements_net_type,
        &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);
  return AddTxOut(value, asset, locking_script);
}